

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void save_column(int symbol,int default_state)

{
  Yshort YVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int local_3c;
  int symno;
  int count;
  Yshort *sp2;
  Yshort *sp1;
  Yshort *sp;
  int n;
  int m;
  int i;
  int default_state_local;
  int symbol_local;
  
  YVar1 = goto_map[symbol];
  iVar2 = goto_map[symbol + 1];
  local_3c = 0;
  for (n = YVar1; n < iVar2; n = n + 1) {
    if (to_state[n] != default_state) {
      local_3c = local_3c + 1;
    }
  }
  if (local_3c != 0) {
    iVar3 = symbol_value[symbol] + nstates * 3;
    piVar4 = (int *)allocate(local_3c << 2);
    froms[iVar3] = piVar4;
    _symno = (Yshort *)allocate(local_3c << 2);
    tos[iVar3] = _symno;
    sp2 = piVar4;
    for (n = YVar1; n < iVar2; n = n + 1) {
      if (to_state[n] != default_state) {
        *sp2 = from_state[n];
        *_symno = to_state[n];
        _symno = _symno + 1;
        sp2 = sp2 + 1;
      }
    }
    tally[iVar3] = local_3c;
    width[iVar3] = (sp2[-1] - *piVar4) + 1;
  }
  return;
}

Assistant:

void save_column(int symbol, int default_state)
{
    register int i;
    register int m;
    register int n;
    register Yshort *sp;
    register Yshort *sp1;
    register Yshort *sp2;
    register int count;
    register int symno;

    m = goto_map[symbol];
    n = goto_map[symbol + 1];

    count = 0;
    for (i = m; i < n; i++)
    {
	if (to_state[i] != default_state)
	    ++count;
    }
    if (count == 0) return;

    symno = symbol_value[symbol] + 3*nstates;

    froms[symno] = sp1 = sp = NEW2(count, Yshort);
    tos[symno] = sp2 = NEW2(count, Yshort);

    for (i = m; i < n; i++)
    {
	if (to_state[i] != default_state)
	{
	    *sp1++ = from_state[i];
	    *sp2++ = to_state[i];
	}
    }

    tally[symno] = count;
    width[symno] = sp1[-1] - sp[0] + 1;
}